

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

void __thiscall
std::pmr::test_resource::do_deallocate(test_resource *this,void *p,size_t bytes,size_t alignment)

{
  uint uVar1;
  test_resource_list *ptVar2;
  memory_resource *pmVar3;
  Link *pLVar4;
  Link *pLVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  test_resource_list *ptVar12;
  char *pcVar13;
  long lVar14;
  Link **ppLVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  undefined8 uVar19;
  uint uVar20;
  
  mutex::lock(&this->m_lock_);
  LOCK();
  (this->m_deallocations_).super___atomic_base<long_long>._M_i =
       (this->m_deallocations_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  (this->m_last_deallocated_address_)._M_b._M_p = p;
  if (p != (void *)0x0) {
    bVar8 = true;
    uVar19 = 0xffffffffffffffff;
    if ((*(int *)((long)p + -0x40) == -0x21524111) && (*(test_resource **)((long)p + -0x18) == this)
       ) {
      sVar18 = *(size_t *)((long)p + -0x38);
      uVar19 = *(undefined8 *)((long)p + -0x28);
      uVar20 = 1;
      for (uVar10 = 0xffffffffffffffff; 0xffffffffffffffef < uVar10; uVar10 = uVar10 - 1) {
        if (*(char *)((long)p + uVar10) != -0x4f) goto LAB_00103024;
        uVar20 = uVar20 + 1;
      }
      uVar20 = 0;
      lVar14 = 0;
      do {
        if (lVar14 == 0x10) goto LAB_00103024;
        lVar17 = lVar14 + 1;
        lVar9 = lVar14 + sVar18;
        lVar14 = lVar17;
      } while (*(char *)((long)p + lVar9) == -0x4f);
      goto LAB_00103026;
    }
    bVar7 = false;
    uVar16 = 0;
    uVar20 = 0;
    sVar18 = 0;
    goto LAB_00102df9;
  }
  if (bytes == 0) {
    (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = 0;
    (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
    goto LAB_00103183;
  }
  LOCK();
  (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
       (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_00103183;
  printf("*** Freeing a nullptr using non-zero size (%zu) with alignment (%zu). ***\n",bytes,
         alignment);
  goto LAB_0010317b;
LAB_00103024:
  lVar17 = 0;
LAB_00103026:
  uVar16 = (uint)lVar17;
  if ((sVar18 == bytes) && (*(size_t *)((long)p + -0x30) == alignment)) {
    bVar8 = false;
    bVar7 = false;
    sVar18 = bytes;
  }
  else {
    bVar7 = true;
    bVar8 = false;
  }
LAB_00102df9:
  if (((!bVar7) && (!bVar8)) && (uVar20 == 0 && uVar16 == 0)) {
    ptVar2 = this->m_list_;
    pmVar3 = this->m_pmr_;
    pLVar4 = *(Link **)((long)p + -0x20);
    pLVar5 = pLVar4->m_prev_;
    if (ptVar2->d_tail_p == pLVar4) {
      ppLVar15 = &ptVar2->d_tail_p;
    }
    else {
      ppLVar15 = &pLVar4->m_next_->m_prev_;
    }
    *ppLVar15 = pLVar5;
    ptVar12 = (test_resource_list *)&pLVar5->m_next_;
    if (ptVar2->d_head_p == pLVar4) {
      ptVar12 = ptVar2;
    }
    ptVar12->d_head_p = pLVar4->m_next_;
    (**(code **)(*(long *)pmVar3 + 0x18))(pmVar3,pLVar4,0x18,8);
    (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = sVar18;
    (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
    LOCK();
    (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
         (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + -1;
    UNLOCK();
    LOCK();
    (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
         (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i - sVar18;
    UNLOCK();
    *(undefined4 *)((long)p + -0x40) = 0xdeadf00d;
    memset(p,0xa5,sVar18);
    if ((this->m_verbose_flag_).super___atomic_base<int>._M_i != 0) {
      printf("test_resource");
      sVar6 = (this->m_name_)._M_len;
      if (sVar6 != 0) {
        printf(" %.*s",sVar6,(this->m_name_)._M_str);
      }
      pcVar13 = "s ";
      if (sVar18 == 1) {
        pcVar13 = " ";
      }
      printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",uVar19,sVar18,pcVar13,alignment
             ,p);
      fflush(_stdout);
    }
    (**(code **)(*(long *)this->m_pmr_ + 0x18))
              (this->m_pmr_,(void *)((long)p + -0x40),sVar18 + 0x50,0x10);
    goto LAB_00103183;
  }
  if (bVar8) {
    LOCK();
    (this->m_mismatches_).super___atomic_base<long_long>._M_i =
         (this->m_mismatches_).super___atomic_base<long_long>._M_i + 1;
    UNLOCK();
  }
  if (bVar7) {
    LOCK();
    (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
         (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
    UNLOCK();
  }
  if (uVar20 != 0 || uVar16 != 0) {
    LOCK();
    (this->m_bounds_errors_).super___atomic_base<long_long>._M_i =
         (this->m_bounds_errors_).super___atomic_base<long_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_00103183;
  uVar1 = *(uint *)((long)p + -0x40);
  uVar10 = *(ulong *)((long)p + -0x38);
  if (uVar1 == 0xdeadbeef) {
    uVar19 = *(undefined8 *)((long)p + -0x30);
    uVar11 = uVar10;
    if (uVar10 == 0) {
      printf("*** Invalid (non-positive) byte count %zu at address %p. *** \n",0,p);
      uVar11 = *(ulong *)((long)p + -0x38);
    }
    if (uVar11 != bytes) {
      printf("*** Freeing segment at %p using wrong size (%zu vs. %zu). ***\n",p,bytes,uVar10);
    }
    if (*(size_t *)((long)p + -0x30) != alignment) {
      printf("*** Freeing segment at %p using wrong alignment (%zu vs. %zu). ***\n",p,alignment,
             uVar19);
    }
    if (*(test_resource **)((long)p + -0x18) != this) {
      printf("*** Freeing segment at %p from wrong allocator. ***\n",p);
    }
    if (uVar20 != 0) {
      printf("*** Memory corrupted at %d bytes before %zu byte segment at %p. ***\n",(ulong)uVar20,
             uVar10,p);
      puts("Pad area before user segment:");
      formatBlock((void *)((long)p + -0x10),0x10);
    }
    if (uVar16 != 0) {
      printf("*** Memory corrupted at %d bytes after %zu byte segment at %p. ***\n",(ulong)uVar16,
             uVar10,p);
      puts("Pad area after user segment:");
      formatBlock((void *)((long)p + uVar10),0x10);
    }
  }
  else if (uVar1 == 0xdeadf00d) {
    printf("*** Deallocating previously deallocated memory at %p. ***\n",p);
  }
  else {
    printf("*** Invalid magic number 0x%08x at address %p. ***\n",(ulong)uVar1,p);
  }
  puts("Header:");
  formatBlock((void *)((long)p + -0x40),0x40);
  puts("User segment:");
  sVar18 = 0x40;
  if (uVar10 < 0x40) {
    sVar18 = uVar10;
  }
  formatBlock(p,sVar18);
LAB_0010317b:
  if ((this->m_no_abort_flag_).super___atomic_base<int>._M_i == 0) {
    abort();
  }
LAB_00103183:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return;
}

Assistant:

void test_resource::do_deallocate(void *p, size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    m_deallocations_.fetch_add(1, memory_order_relaxed);
    m_last_deallocated_address_.store(p, memory_order_relaxed);

    if (nullptr == p) {
        if (0 != bytes) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
            if (!is_quiet()) {
                formatBadBytesForNullptr(bytes, alignment);
                if (!is_no_abort()) {
                    std::abort();                                      // ABORT
                }
            }
        }
        else {
            m_last_deallocated_num_bytes_.store(0,
                                                memory_order_relaxed);
            m_last_deallocated_alignment_.store(alignment,
                                                memory_order_relaxed);
        }
        return;                                                       // RETURN
    }

    AlignedHeader *head = (AlignedHeader *)p - 1;

    bool miscError  = false;
    bool paramError = false;

    size_t     size            = 0;
    long long  allocationIndex = -1;

    // The following checks are done deliberately in the order shown to avoid a
    // possible bus error when attempting to read a misaligned 64-bit integer,
    // which can happen if an invalid address is passed to this method.  If the
    // address of the memory being deallocated is misaligned, it is very likely
    // that 'm_magic_number_' will not match the expected value, and so we will
    // skip the reading of 'm_bytes_' (a 64-bit integer).

    if (allocatedMemoryPattern != head->m_object_.m_magic_number_) {
        miscError = true;
    }
    else if (this != head->m_object_.m_pmr_) {
        miscError = true;
    }
    else {
        size            = head->m_object_.m_bytes_;
        allocationIndex = head->m_object_.m_index_;
    }

    // If there is evidence of corruption, this memory may have already been
    // freed.  On some platforms (but not others), the 'free' function will
    // scribble freed memory.  To get uniform behavior for test drivers, we
    // deliberately don't check over/underruns if 'miscError' is 'true'.

    int overrunBy  = 0;
    int underrunBy = 0;

    if (!miscError) {
        byte *pcBegin;
        byte *pcEnd;

        // Check the padding before the segment.  Go backwards so we will
        // report the trashed byte nearest the segment.

        pcBegin = (byte *)p - 1;
        pcEnd   = (byte *)&head->m_object_.m_padding_;

        for (byte *pc = pcBegin; pcEnd <= pc; --pc) {
            if (paddedMemoryByte != *pc) {
                underrunBy = static_cast<int>(pcBegin + 1 - pc);
                break;
            }
        }

        if (!underrunBy) {
            // Check the padding after the segment.

            byte *tail = (byte *)p + size;
            pcBegin = tail;
            pcEnd = tail + paddingSize;
            for (byte *pc = pcBegin; pc < pcEnd; ++pc) {
                if (paddedMemoryByte != *pc) {
                    overrunBy = static_cast<int>(pc + 1 - pcBegin);
                    break;
                }
            }
        }

        if (bytes != size || alignment != head->m_object_.m_alignment_) {
            paramError = true;
        }
    }

    // Now check for corrupted memory block and cross allocation.

    if (!miscError && !overrunBy && !underrunBy &&!paramError) {
        m_pmr_->deallocate(removeLink(m_list_,
                                      head->m_object_.m_address_),
                           sizeof(Link), alignof(Link));
    }
    else { // Any error, count it, report it
        if (miscError) {
            m_mismatches_.fetch_add(1, memory_order_relaxed);
        }
        if (paramError) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
        }
        if (overrunBy || underrunBy) {
            m_bounds_errors_.fetch_add(1, memory_order_relaxed);
        }

        if (is_quiet()) {
            return;                                                   // RETURN
        }
        else {
            formatInvalidMemoryBlock(head, bytes, alignment,
                                     this, underrunBy, overrunBy);
            if (is_no_abort()) {
                return;                                               // RETURN
            }
            else {
                std::abort();                                          // ABORT
            }
        }
    }

    // At this point we know (almost) for sure that the memory block is
    // currently allocated from this object.  We now proceed to update our
    // statistics, stamp the block's header as deallocated, scribble over its
    // payload, and give it back to the underlying allocator supplied at
    // construction.  In verbose mode, we also report the deallocation event to
    // 'stdout'.

    m_last_deallocated_num_bytes_.store(static_cast<long long>(size),
                                        memory_order_relaxed);
    m_last_deallocated_alignment_.store(static_cast<long long>(alignment),
                                        memory_order_relaxed);

    m_blocks_in_use_.fetch_add(-1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(-static_cast<long long>(size),
                              memory_order_relaxed);

    head->m_object_.m_magic_number_ = deallocatedMemoryPattern;

    std::memset(p, static_cast<int>(scribbledMemoryByte), size);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator local [245]: Deallocated 1 byte at 0x3c1b2740.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               size,
               1 == size ? " " : "s ",
               alignment,
               p);

        std::fflush(stdout);
    }

    m_pmr_->deallocate(head, sizeof(AlignedHeader) + size + paddingSize);
}